

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBigInt.cpp
# Opt level: O0

JavascriptBigInt * Js::JavascriptBigInt::New(JavascriptBigInt *pbi,ScriptContext *scriptContext)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Recycler *pRVar5;
  JavascriptBigInt *this;
  JavascriptLibrary *this_00;
  StaticType *type;
  unsigned_long *puVar6;
  unsigned_long **ppuVar7;
  TrackAllocData local_80;
  code *local_58;
  undefined8 local_50;
  TrackAllocData local_48;
  JavascriptBigInt *local_20;
  JavascriptBigInt *bigintNew;
  ScriptContext *scriptContext_local;
  JavascriptBigInt *pbi_local;
  
  bigintNew = (JavascriptBigInt *)scriptContext;
  scriptContext_local = (ScriptContext *)pbi;
  if (pbi->m_maxLength < pbi->m_length) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBigInt.cpp"
                                ,0x26,"(pbi->m_maxLength >= pbi->m_length)",
                                "pbi->m_maxLength >= pbi->m_length");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pRVar5 = ScriptContext::GetRecycler((ScriptContext *)bigintNew);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBigInt.cpp"
             ,0x27);
  pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_48);
  local_58 = Memory::Recycler::AllocInlined;
  local_50 = 0;
  this = (JavascriptBigInt *)new<Memory::Recycler>(0x30,pRVar5,0x43c4b0);
  this_00 = ScriptContext::GetLibrary((ScriptContext *)bigintNew);
  type = JavascriptLibrary::GetBigIntTypeStatic(this_00);
  JavascriptBigInt(this,type);
  this->m_length = *(Type *)&(scriptContext_local->super_ScriptContextBase).isClosed;
  this->m_maxLength = (Type)(scriptContext_local->super_ScriptContextBase).pActiveScriptDirect;
  this->m_isNegative = (Type)(*(byte *)&scriptContext_local->jitFuncRangeCache & 1);
  local_20 = this;
  pRVar5 = ScriptContext::GetRecycler((ScriptContext *)bigintNew);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_80,(type_info *)&unsigned_long::typeinfo,0,
             (size_t)(scriptContext_local->super_ScriptContextBase).pActiveScriptDirect,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBigInt.cpp"
             ,0x2b);
  pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_80);
  puVar6 = Memory::AllocateArray<Memory::Recycler,unsigned_long,false>
                     ((Memory *)pRVar5,(Recycler *)Memory::Recycler::AllocLeaf,0,
                      (size_t)(scriptContext_local->super_ScriptContextBase).pActiveScriptDirect);
  Memory::WriteBarrierPtr<unsigned_long>::operator=(&local_20->m_digits,puVar6);
  ppuVar7 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_long__
                      ((WriteBarrierPtr *)&local_20->m_digits);
  puVar6 = *ppuVar7;
  TVar1 = local_20->m_length;
  ppuVar7 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_long__
                      ((WriteBarrierPtr *)
                       &(scriptContext_local->super_ScriptContextBase).globalObject);
  js_memcpy_s(puVar6,TVar1 << 3,*ppuVar7,local_20->m_length << 3);
  return local_20;
}

Assistant:

JavascriptBigInt * JavascriptBigInt::New(JavascriptBigInt * pbi, ScriptContext * scriptContext)
    {
        Assert(pbi->m_maxLength >= pbi->m_length);
        JavascriptBigInt * bigintNew = RecyclerNew(scriptContext->GetRecycler(), JavascriptBigInt, scriptContext->GetLibrary()->GetBigIntTypeStatic());
        bigintNew->m_length = pbi->m_length;
        bigintNew->m_maxLength = pbi->m_maxLength;
        bigintNew->m_isNegative = pbi->m_isNegative;
        bigintNew->m_digits = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), digit_t, pbi->m_maxLength);
        js_memcpy_s(bigintNew->m_digits, bigintNew->m_length * sizeof(digit_t), pbi->m_digits, bigintNew->m_length * sizeof(digit_t));
 
        return bigintNew;
    }